

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_write_certificate(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_ciphersuite_t *info;
  ulong __n;
  int iVar1;
  mbedtls_x509_crt *pmVar2;
  mbedtls_ssl_ciphersuite_t *ciphersuite_info;
  mbedtls_x509_crt *crt;
  size_t n;
  size_t i;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  info = ssl->handshake->ciphersuite_info;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
             ,0x1b03,"=> write certificate");
  iVar1 = mbedtls_ssl_ciphersuite_uses_srv_cert(info);
  if (iVar1 == 0) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x1b06,"<= skip write certificate");
    ssl->state = ssl->state + 1;
    ssl_local._4_4_ = 0;
  }
  else if ((ssl->conf->endpoint == '\0') && (ssl->handshake->client_auth == '\0')) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x1b0e,"<= skip write certificate");
    ssl->state = ssl->state + 1;
    ssl_local._4_4_ = 0;
  }
  else if ((ssl->conf->endpoint == '\x01') &&
          (pmVar2 = mbedtls_ssl_own_cert(ssl), pmVar2 == (mbedtls_x509_crt *)0x0)) {
    ssl_local._4_4_ = -0x6c00;
  }
  else {
    pmVar2 = mbedtls_ssl_own_cert(ssl);
    mbedtls_debug_print_crt
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x1b1e,"own certificate",pmVar2);
    n = 7;
    for (ciphersuite_info = (mbedtls_ssl_ciphersuite_t *)mbedtls_ssl_own_cert(ssl);
        ciphersuite_info != (mbedtls_ssl_ciphersuite_t *)0x0;
        ciphersuite_info = *(mbedtls_ssl_ciphersuite_t **)(ciphersuite_info + 0x1f)) {
      __n = *(ulong *)&ciphersuite_info->cipher;
      if (0x3fd - n < __n) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x1b31,"certificate too large, %zu > %zu",n + 3 + __n,0x400);
        return -0x6a00;
      }
      ssl->out_msg[n] = (uchar)(__n >> 0x10);
      ssl->out_msg[n + 1] = (uchar)(__n >> 8);
      ssl->out_msg[n + 2] = (uchar)__n;
      memcpy(ssl->out_msg + n + 3,*(void **)(ciphersuite_info + 1),__n);
      n = __n + n + 3;
    }
    ssl->out_msg[4] = (uchar)(n - 7 >> 0x10);
    ssl->out_msg[5] = (uchar)(n - 7 >> 8);
    ssl->out_msg[6] = (char)n + 0xf9;
    ssl->out_msglen = n;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\v';
    ssl->state = ssl->state + 1;
    ssl_local._4_4_ = mbedtls_ssl_write_handshake_msg(ssl);
    if (ssl_local._4_4_ == 0) {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x1b4c,"<= write certificate");
    }
    else {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x1b48,"mbedtls_ssl_write_handshake_msg",ssl_local._4_4_);
    }
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_write_certificate(mbedtls_ssl_context *ssl)
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    size_t i, n;
    const mbedtls_x509_crt *crt;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info =
        ssl->handshake->ciphersuite_info;

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> write certificate"));

    if (!mbedtls_ssl_ciphersuite_uses_srv_cert(ciphersuite_info)) {
        MBEDTLS_SSL_DEBUG_MSG(2, ("<= skip write certificate"));
        ssl->state++;
        return 0;
    }

#if defined(MBEDTLS_SSL_CLI_C)
    if (ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT) {
        if (ssl->handshake->client_auth == 0) {
            MBEDTLS_SSL_DEBUG_MSG(2, ("<= skip write certificate"));
            ssl->state++;
            return 0;
        }
    }
#endif /* MBEDTLS_SSL_CLI_C */
#if defined(MBEDTLS_SSL_SRV_C)
    if (ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER) {
        if (mbedtls_ssl_own_cert(ssl) == NULL) {
            /* Should never happen because we shouldn't have picked the
             * ciphersuite if we don't have a certificate. */
            return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
        }
    }
#endif

    MBEDTLS_SSL_DEBUG_CRT(3, "own certificate", mbedtls_ssl_own_cert(ssl));

    /*
     *     0  .  0    handshake type
     *     1  .  3    handshake length
     *     4  .  6    length of all certs
     *     7  .  9    length of cert. 1
     *    10  . n-1   peer certificate
     *     n  . n+2   length of cert. 2
     *    n+3 . ...   upper level cert, etc.
     */
    i = 7;
    crt = mbedtls_ssl_own_cert(ssl);

    while (crt != NULL) {
        n = crt->raw.len;
        if (n > MBEDTLS_SSL_OUT_CONTENT_LEN - 3 - i) {
            MBEDTLS_SSL_DEBUG_MSG(1, ("certificate too large, %" MBEDTLS_PRINTF_SIZET
                                      " > %" MBEDTLS_PRINTF_SIZET,
                                      i + 3 + n, (size_t) MBEDTLS_SSL_OUT_CONTENT_LEN));
            return MBEDTLS_ERR_SSL_BUFFER_TOO_SMALL;
        }

        ssl->out_msg[i] = MBEDTLS_BYTE_2(n);
        ssl->out_msg[i + 1] = MBEDTLS_BYTE_1(n);
        ssl->out_msg[i + 2] = MBEDTLS_BYTE_0(n);

        i += 3; memcpy(ssl->out_msg + i, crt->raw.p, n);
        i += n; crt = crt->next;
    }

    ssl->out_msg[4]  = MBEDTLS_BYTE_2(i - 7);
    ssl->out_msg[5]  = MBEDTLS_BYTE_1(i - 7);
    ssl->out_msg[6]  = MBEDTLS_BYTE_0(i - 7);

    ssl->out_msglen  = i;
    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = MBEDTLS_SSL_HS_CERTIFICATE;

    ssl->state++;

    if ((ret = mbedtls_ssl_write_handshake_msg(ssl)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ssl_write_handshake_msg", ret);
        return ret;
    }

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= write certificate"));

    return ret;
}